

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

size_t gguf_get_arr_n(gguf_context *ctx,int64_t key_id)

{
  pointer pgVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  int line;
  
  if ((key_id < 0) ||
     (pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_start,
     ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pgVar1) / 0x58 <= key_id)) {
    pcVar4 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
    line = 0x317;
  }
  else {
    if (pgVar1[key_id].type == GGUF_TYPE_STRING) {
      return (long)*(pointer *)
                    ((long)&pgVar1[key_id].data_string.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl + 8) -
             *(long *)&pgVar1[key_id].data_string.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data >> 5;
    }
    sVar2 = gguf_type_size(GGUF_TYPE_UINT8);
    pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)*(pointer *)
                   ((long)&pgVar1[key_id].data.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl + 8
                   ) -
            *(long *)&pgVar1[key_id].data.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl;
    if (uVar3 % sVar2 == 0) {
      return uVar3 / sVar2;
    }
    pcVar4 = "ctx->kv[key_id].data.size() % type_size == 0";
    line = 0x31e;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

size_t gguf_get_arr_n(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));

    if (ctx->kv[key_id].type == GGUF_TYPE_STRING) {
        return ctx->kv[key_id].data_string.size();
    }

    const size_t type_size = gguf_type_size(ctx->kv[key_id].type);
    GGML_ASSERT(ctx->kv[key_id].data.size() % type_size == 0);
    return ctx->kv[key_id].data.size() / type_size;
}